

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O3

Parsekey __thiscall
free_format_parser::HMpsFF::parseRhs(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  ulong *puVar1;
  Boundtype BVar2;
  uint uVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  Parsekey PVar7;
  int iVar8;
  long lVar9;
  iterator iVar10;
  size_t sVar11;
  double dVar12;
  HighsInt id;
  uint uVar13;
  ulong uVar14;
  HMpsFF *pHVar15;
  char cVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  bool skip;
  string marker;
  string word;
  bool is_nan;
  size_t begin;
  string strline;
  Parsekey local_118;
  bool local_111;
  HighsLogOptions *local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  HMpsFF *local_e8;
  string local_e0;
  undefined1 local_c0 [32];
  double local_a0;
  vector<bool,_std::allocator<bool>_> *local_98;
  string local_90;
  double local_70;
  undefined1 local_68 [16];
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pHVar15 = (HMpsFF *)&this->has_row_entry_;
  local_110 = log_options;
  local_98 = (vector<bool,_std::allocator<bool>_> *)pHVar15;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
            ((vector<bool,_std::allocator<bool>_> *)pHVar15,(long)this->num_row,false);
  this->has_obj_entry_ = false;
  local_e8 = (HMpsFF *)&this->rowname2idx;
  local_108 = 1;
  local_f0 = 0;
  local_100 = 1;
  local_f8 = 0;
  while( true ) {
    do {
      bVar5 = getMpsLine(pHVar15,file,&local_50,&local_111);
      if (!bVar5) {
        local_118 = kFail;
        goto LAB_001f61db;
      }
    } while (local_111 != false);
    if ((0.0 < this->time_limit_) &&
       (lVar9 = std::chrono::_V2::system_clock::now(),
       dVar12 = (double)lVar9 / 1000000000.0 - this->start_time,
       this->time_limit_ <= dVar12 && dVar12 != this->time_limit_)) break;
    local_70 = 0.0;
    local_a0 = 0.0;
    local_c0._8_8_ = (char *)0x0;
    local_c0[0x10] = '\0';
    local_c0._0_8_ = (HMpsFF *)(local_c0 + 0x10);
    PVar7 = checkFirstWord(this,&local_50,(size_t *)&local_70,(size_t *)&local_a0,(string *)local_c0
                          );
    if (PVar7 == kRhs) {
LAB_001f5aaa:
      dVar12 = local_a0;
      first_word(&local_e0,&local_50,(size_t)local_a0);
      sVar11 = first_word_end(&local_50,(size_t)dVar12);
      id = 0x3cbf27;
      std::__cxx11::string::_M_replace((ulong)local_c0,0,(char *)local_c0._8_8_,0x3cbf27);
      first_word(&local_90,&local_50,sVar11);
      std::__cxx11::string::operator=((string *)local_c0,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) !=
          &local_90.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p));
      }
      dVar12 = (double)first_word_end(&local_50,sVar11);
      iVar8 = std::__cxx11::string::compare(local_c0);
      if (iVar8 == 0) {
        trim(&local_e0,&default_non_chars_abi_cxx11_);
        highsLogUser(local_110,kError,"No bound given for row \"%s\"\n",local_e0._M_dataplus._M_p);
LAB_001f6107:
        local_118 = kFail;
        bVar5 = true;
      }
      else {
        pHVar15 = local_e8;
        iVar10 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_e8,&local_e0);
        if (iVar10.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          if ((local_e0._M_string_length == (this->mps_name)._M_string_length) &&
             ((local_e0._M_string_length == 0 ||
              (iVar8 = bcmp(local_e0._M_dataplus._M_p,(this->mps_name)._M_dataplus._M_p,
                            local_e0._M_string_length), iVar8 == 0)))) {
            std::__cxx11::string::_M_assign((string *)&local_e0);
            id = 0x3cbf27;
            std::__cxx11::string::_M_replace((ulong)local_c0,0,(char *)local_c0._8_8_,0x3cbf27);
            first_word(&local_90,&local_50,(size_t)dVar12);
            std::__cxx11::string::operator=((string *)local_c0,(string *)&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) !=
                &local_90.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_90._M_dataplus._M_p._1_7_,
                                       (char)local_90._M_dataplus._M_p));
            }
            dVar12 = (double)first_word_end(&local_50,(size_t)dVar12);
            local_a0 = dVar12;
            iVar8 = std::__cxx11::string::compare(local_c0);
            if (iVar8 == 0) {
              trim(&local_e0,&default_non_chars_abi_cxx11_);
              highsLogUser(local_110,kError,"No bound given for SIF row \"%s\"\n",
                           local_e0._M_dataplus._M_p);
              goto LAB_001f6107;
            }
            pHVar15 = local_e8;
            iVar10 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_e8,&local_e0);
            if (iVar10.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                ._M_cur != (__node_type *)0x0) goto LAB_001f5b5c;
          }
          local_f8 = local_f8 + 1;
          if (local_f8 % local_108 == 0) {
            highsLogUser(local_110,kWarning,
                         "Row name \"%s\" in RHS section is not defined: ignored\n",
                         local_e0._M_dataplus._M_p);
            local_108 = local_108 * 2;
          }
        }
        else {
LAB_001f5b5c:
          local_90._M_dataplus._M_p._0_1_ = '\0';
          dVar4 = getValue(pHVar15,(string *)local_c0,(bool *)&local_90,id);
          local_68._8_4_ = extraout_XMM0_Dc;
          local_68._0_8_ = dVar4;
          local_68._12_4_ = extraout_XMM0_Dd;
          iVar10 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_e8,&local_e0);
          uVar13 = *(uint *)((long)iVar10.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                   ._M_cur + 0x28);
          uVar14 = (ulong)uVar13;
          if ((int)uVar13 < 0) {
            if (this->has_obj_entry_ != false) goto LAB_001f5daf;
            if ((char)local_90._M_dataplus._M_p == '\x01') goto LAB_001f5e0e;
            this->obj_offset = -(double)local_68._0_8_;
            this->has_obj_entry_ = true;
          }
          else if (((local_98->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] >>
                    (uVar14 & 0x3f) & 1) == 0) {
            if ((char)local_90._M_dataplus._M_p != '\0') {
LAB_001f5e0e:
              highsLogUser(local_110,kError,"RHS for row \"%s\" is NaN\n",local_e0._M_dataplus._M_p)
              ;
              goto LAB_001f6107;
            }
            BVar2 = (this->row_type).
                    super__Vector_base<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar14];
            if (BVar2 == kLe) {
              lVar9 = 0x100;
LAB_001f5e89:
              *(undefined8 *)(*(long *)((long)&this->time_limit_ + lVar9) + uVar14 * 8) =
                   local_68._0_8_;
            }
            else {
              if (BVar2 == kGe) {
LAB_001f5bf5:
                lVar9 = 0xe8;
                goto LAB_001f5e89;
              }
              if (BVar2 == kEq) {
                (this->row_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14] = (double)local_68._0_8_;
                goto LAB_001f5bf5;
              }
            }
            puVar1 = (local_98->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar13 >> 6)
            ;
            *puVar1 = *puVar1 | 1L << ((byte)uVar13 & 0x3f);
          }
          else {
LAB_001f5daf:
            local_f0 = local_f0 + 1;
            if (local_f0 % local_100 == 0) {
              highsLogUser(local_110,kWarning,
                           "Row name \"%s\" in RHS section has duplicate value %g: ignored\n",
                           local_68._0_4_,local_e0._M_dataplus._M_p);
              local_100 = local_100 * 2;
            }
          }
        }
        bVar6 = is_end(&local_50,(size_t)dVar12,&default_non_chars_abi_cxx11_);
        bVar5 = false;
        if (!bVar6) {
          first_word(&local_90,&local_50,(size_t)dVar12);
          std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) !=
              &local_90.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p
                                    ));
          }
          iVar8 = std::__cxx11::string::compare(local_c0);
          if (iVar8 == 0) {
            trim(&local_e0,&default_non_chars_abi_cxx11_);
            highsLogUser(local_110,kError,"No coefficient given for rhs of row \"%s\"\n",
                         local_e0._M_dataplus._M_p);
            goto LAB_001f6107;
          }
          sVar11 = first_word_end(&local_50,(size_t)dVar12);
          uVar13 = 0x3cbf27;
          std::__cxx11::string::_M_replace((ulong)local_c0,0,(char *)local_c0._8_8_,0x3cbf27);
          first_word(&local_90,&local_50,sVar11 + 1);
          std::__cxx11::string::operator=((string *)local_c0,(string *)&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) !=
              &local_90.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p
                                    ));
          }
          local_a0 = (double)first_word_end(&local_50,sVar11 + 1);
          iVar10 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_e8,&local_e0);
          if (iVar10.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
              ._M_cur == (__node_type *)0x0) {
            local_f8 = local_f8 + 1;
            bVar5 = false;
            if (local_f8 % local_108 == 0) {
              highsLogUser(local_110,kWarning,
                           "Row name \"%s\" in RHS section is not defined: ignored\n",
                           local_e0._M_dataplus._M_p);
              local_108 = local_108 * 2;
            }
          }
          else {
            pHVar15 = local_e8;
            iVar10 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_e8,&local_e0);
            uVar3 = *(uint *)((long)iVar10.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                    ._M_cur + 0x28);
            uVar14 = (ulong)uVar3;
            if ((int)uVar3 < 0) {
              cVar16 = this->has_obj_entry_;
            }
            else {
              uVar13 = uVar3 >> 6;
              cVar16 = ((local_98->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar13] >>
                        (uVar14 & 0x3f) & 1) != 0;
            }
            local_90._M_dataplus._M_p._0_1_ = '\0';
            dVar12 = getValue(pHVar15,(string *)local_c0,(bool *)&local_90,uVar13);
            if (cVar16 == '\0') {
              if ((char)local_90._M_dataplus._M_p == '\x01') {
                highsLogUser(local_110,kError,"RHS for row \"%s\" is NaN\n",
                             local_e0._M_dataplus._M_p);
                goto LAB_001f6107;
              }
              if ((int)uVar3 < 0) {
                this->obj_offset = -dVar12;
                this->has_obj_entry_ = true;
              }
              else {
                BVar2 = (this->row_type).
                        super__Vector_base<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar14];
                if (BVar2 == kLe) {
                  lVar9 = 0x100;
LAB_001f61a2:
                  *(double *)(*(long *)((long)&this->time_limit_ + lVar9) + uVar14 * 8) = dVar12;
                }
                else {
                  if (BVar2 == kGe) {
LAB_001f617e:
                    lVar9 = 0xe8;
                    goto LAB_001f61a2;
                  }
                  if (BVar2 == kEq) {
                    (this->row_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar14] = dVar12;
                    goto LAB_001f617e;
                  }
                }
                puVar1 = (local_98->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         (uVar3 >> 6);
                *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
              }
              bVar5 = false;
            }
            else {
              local_f0 = local_f0 + 1;
              bVar5 = false;
              if (local_f0 % local_100 == 0) {
                highsLogUser(local_110,kWarning,
                             "Row name \"%s\" in RHS section has duplicate value %g: ignored\n",
                             local_e0._M_dataplus._M_p);
                local_100 = local_100 * 2;
                bVar5 = false;
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
    }
    else {
      if (PVar7 == kNone) {
        iVar10 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_e8,(key_type *)local_c0);
        if (iVar10.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
            ._M_cur != (__node_type *)0x0) {
          local_a0 = local_70;
        }
        goto LAB_001f5aaa;
      }
      this->warning_issued_ = local_f8 != 0 || local_f0 != 0;
      if (local_f8 != 0 || local_f0 != 0) {
        highsLogUser(local_110,kWarning,
                     "RHS section: ignored %d undefined rows and %d duplicate values\n",local_f8,
                     local_f0);
      }
      bVar5 = true;
      highsLogDev(local_110,kInfo,"readMPS: Read RHS     OK\n");
      local_118 = PVar7;
    }
    pHVar15 = (HMpsFF *)local_c0._0_8_;
    if ((HMpsFF *)local_c0._0_8_ != (HMpsFF *)(local_c0 + 0x10)) {
      operator_delete((void *)local_c0._0_8_);
    }
    if (bVar5) {
LAB_001f61db:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      return local_118;
    }
  }
  local_118 = kTimeout;
  goto LAB_001f61db;
}

Assistant:

HMpsFF::Parsekey HMpsFF::parseRhs(const HighsLogOptions& log_options,
                                  std::istream& file) {
  std::string strline;

  auto parseName = [this](const std::string& name, HighsInt& rowidx,
                          bool& has_entry) {
    auto mit = rowname2idx.find(name);

    assert(mit != rowname2idx.end());
    rowidx = mit->second;

    assert(rowidx < num_row);

    if (rowidx > -1) {
      has_entry = has_row_entry_[rowidx];
    } else {
      assert(rowidx == -1);
      has_entry = has_obj_entry_;
    }
  };

  auto addRhs = [this](double val, HighsInt rowidx) {
    if (rowidx > -1) {
      if (row_type[rowidx] == Boundtype::kEq ||
          row_type[rowidx] == Boundtype::kLe) {
        assert(size_t(rowidx) < row_upper.size());
        row_upper[rowidx] = val;
      }
      if (row_type[rowidx] == Boundtype::kEq ||
          row_type[rowidx] == Boundtype::kGe) {
        assert(size_t(rowidx) < row_lower.size());
        row_lower[rowidx] = val;
      }
      has_row_entry_[rowidx] = true;
    } else {
      // objective shift
      assert(rowidx == -1);
      obj_offset = -val;
      has_obj_entry_ = true;
    }
  };

  // Initialise tracking for duplicate entries
  has_row_entry_.assign(num_row, false);
  has_obj_entry_ = false;
  bool has_entry = false;

  bool skip;
  size_t num_ignored_row_name = 0;
  size_t report_ignored_row_name_frequency = 1;
  size_t num_ignored_duplicate_rhs = 0;
  size_t report_ignored_duplicate_rhs_frequency = 1;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin = 0;
    size_t end = 0;
    std::string word;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, word);

    // start of new section?
    if (key != Parsekey::kNone && key != Parsekey::kRhs) {
      warning_issued_ =
          num_ignored_row_name > 0 || num_ignored_duplicate_rhs > 0;
      if (warning_issued_)
        highsLogUser(
            log_options, HighsLogType::kWarning,
            "RHS section: ignored %d undefined rows and %d duplicate values\n",
            int(num_ignored_row_name), int(num_ignored_duplicate_rhs));
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read RHS     OK\n");
      return key;
    }

    // Ignore lack of name for SIF format;
    // we know we have this case when "word" is a row name
    if ((key == Parsekey::kNone) && (key != Parsekey::kRhs) &&
        (rowname2idx.find(word) != rowname2idx.end())) {
      end = begin;
    }

    HighsInt rowidx;

    std::string marker = first_word(strline, end);
    size_t end_marker = first_word_end(strline, end);

    // here marker is the row name and end marks its end
    word = "";
    word = first_word(strline, end_marker);
    end = first_word_end(strline, end_marker);

    if (word == "") {
      trim(marker);
      highsLogUser(log_options, HighsLogType::kError,
                   "No bound given for row \"%s\"\n", marker.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    auto mit = rowname2idx.find(marker);

    // SIF format sometimes has the name of the MPS file
    // prepended to the RHS entry; remove it here if
    // that's the case. "word" will then hold the marker,
    // so also get new "word" and "end" values
    if (mit == rowname2idx.end()) {
      if (marker == mps_name) {
        marker = word;
        end_marker = end;
        word = "";
        word = first_word(strline, end_marker);
        end = first_word_end(strline, end_marker);
        if (word == "") {
          trim(marker);
          highsLogUser(log_options, HighsLogType::kError,
                       "No bound given for SIF row \"%s\"\n", marker.c_str());
          return HMpsFF::Parsekey::kFail;
        }
        mit = rowname2idx.find(marker);
      }
    }

    if (mit == rowname2idx.end()) {
      num_ignored_row_name++;
      if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
        highsLogUser(log_options, HighsLogType::kWarning,
                     "Row name \"%s\" in RHS section is not defined: ignored\n",
                     marker.c_str());
        report_ignored_row_name_frequency *= 2;
      }
    } else {
      bool is_nan = false;
      double value = getValue(word, is_nan);  // atof(word.c_str());
      parseName(marker, rowidx, has_entry);
      if (has_entry) {
        num_ignored_duplicate_rhs++;
        if (num_ignored_duplicate_rhs %
                report_ignored_duplicate_rhs_frequency ==
            0) {
          highsLogUser(log_options, HighsLogType::kWarning,
                       "Row name \"%s\" in RHS section has duplicate value %g: "
                       "ignored\n",
                       marker.c_str(), value);
          report_ignored_duplicate_rhs_frequency *= 2;
        }
      } else {
        if (is_nan) {
          highsLogUser(log_options, HighsLogType::kError,
                       "RHS for row \"%s\" is NaN\n", marker.c_str());
          return HMpsFF::Parsekey::kFail;
        }
        addRhs(value, rowidx);
      }
    }

    if (!is_end(strline, end)) {
      // parse second coefficient
      marker = first_word(strline, end);
      if (word == "") {
        trim(marker);
        highsLogUser(log_options, HighsLogType::kError,
                     "No coefficient given for rhs of row \"%s\"\n",
                     marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      end_marker = first_word_end(strline, end);

      // here marker is the row name and end marks its end
      word = "";
      end_marker++;
      word = first_word(strline, end_marker);
      end = first_word_end(strline, end_marker);

      assert(is_end(strline, end));

      auto mit = rowname2idx.find(marker);
      if (mit == rowname2idx.end()) {
        num_ignored_row_name++;
        if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
          highsLogUser(
              log_options, HighsLogType::kWarning,
              "Row name \"%s\" in RHS section is not defined: ignored\n",
              marker.c_str());
          report_ignored_row_name_frequency *= 2;
        }
        continue;
      };

      parseName(marker, rowidx, has_entry);
      bool is_nan = false;
      double value = getValue(word, is_nan);  // atof(word.c_str());
      if (has_entry) {
        num_ignored_duplicate_rhs++;
        if (num_ignored_duplicate_rhs %
                report_ignored_duplicate_rhs_frequency ==
            0) {
          highsLogUser(log_options, HighsLogType::kWarning,
                       "Row name \"%s\" in RHS section has duplicate value %g: "
                       "ignored\n",
                       marker.c_str(), value);
          report_ignored_duplicate_rhs_frequency *= 2;
        }
      } else {
        if (is_nan) {
          highsLogUser(log_options, HighsLogType::kError,
                       "RHS for row \"%s\" is NaN\n", marker.c_str());
          return HMpsFF::Parsekey::kFail;
        }
        addRhs(value, rowidx);
      }
    }
  }

  return Parsekey::kFail;
}